

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

void FlatZinc::anon_unknown_4::p_int_CMP_reif(IntRelType irt,ConExpr *ce,Node *ann)

{
  bool bVar1;
  IntVar *pIVar2;
  IntRelType in_EDI;
  int in_stack_00000154;
  BoolView *in_stack_00000158;
  IntVar *in_stack_00000160;
  IntRelType in_stack_0000016c;
  IntVar *in_stack_00000170;
  int in_stack_ffffffffffffff4c;
  ConExpr *in_stack_ffffffffffffff50;
  IntRelType in_stack_ffffffffffffff60;
  Node *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ConExpr *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  IntRelType irt_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  IntRelType in_stack_ffffffffffffffac;
  IntVar *in_stack_ffffffffffffffb0;
  
  irt_00 = (IntRelType)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  bVar1 = AST::Node::isBool((Node *)in_stack_ffffffffffffff50);
  if (bVar1) {
    ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bVar1 = AST::Node::getBool((Node *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              );
    if (bVar1) {
      p_int_CMP(irt_00,in_stack_ffffffffffffff78,
                (Node *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    else {
      operator!(in_stack_ffffffffffffff60);
      p_int_CMP(irt_00,in_stack_ffffffffffffff78,
                (Node *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
  }
  else {
    ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    bVar1 = AST::Node::isIntVar((Node *)in_stack_ffffffffffffff50);
    if (bVar1) {
      ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      bVar1 = AST::Node::isIntVar((Node *)in_stack_ffffffffffffff50);
      if (bVar1) {
        ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        getIntVar((Node *)in_stack_ffffffffffffff50);
        ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        getIntVar((Node *)in_stack_ffffffffffffff50);
        ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        getBoolVar(in_stack_ffffffffffffff68);
        int_rel_reif(in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_00000158,
                     in_stack_00000154);
        BoolView::~BoolView((BoolView *)0x1639e4);
      }
      else {
        ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        pIVar2 = getIntVar((Node *)in_stack_ffffffffffffff50);
        ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        AST::Node::getInt((Node *)CONCAT44(in_stack_ffffffffffffff74,in_EDI));
        ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        getBoolVar((Node *)pIVar2);
        int_rel_reif(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                     (BoolView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        BoolView::~BoolView((BoolView *)0x163a9b);
      }
    }
    else {
      ConExpr::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      pIVar2 = getIntVar((Node *)in_stack_ffffffffffffff50);
      ::operator-(in_EDI);
      ConExpr::operator[]((ConExpr *)pIVar2,in_stack_ffffffffffffff4c);
      AST::Node::getInt((Node *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      ConExpr::operator[]((ConExpr *)pIVar2,in_stack_ffffffffffffff4c);
      getBoolVar(in_stack_ffffffffffffff68);
      int_rel_reif(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (BoolView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      BoolView::~BoolView((BoolView *)0x163b56);
    }
  }
  return;
}

Assistant:

void p_int_CMP_reif(IntRelType irt, const ConExpr& ce, AST::Node* ann) {
	if (ce[2]->isBool()) {
		if (ce[2]->getBool()) {
			p_int_CMP(irt, ce, ann);
		} else {
			p_int_CMP(!irt, ce, ann);
		}
		return;
	}
	if (ce[0]->isIntVar()) {
		if (ce[1]->isIntVar()) {
			int_rel_reif(getIntVar(ce[0]), irt, getIntVar(ce[1]), getBoolVar(ce[2]));
		} else {
			int_rel_reif(getIntVar(ce[0]), irt, ce[1]->getInt(), getBoolVar(ce[2]));
		}
	} else {
		int_rel_reif(getIntVar(ce[1]), -irt, ce[0]->getInt(), getBoolVar(ce[2]));
	}
}